

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionCosserat.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElasticityCosserat::ComputeStiffnessMatrix
          (ChElasticityCosserat *this,ChMatrixNM<double,_6,_6> *K,ChVector<double> *strain_e,
          ChVector<double> *strain_k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  int i;
  long lVar7;
  ushort uVar8;
  ulong uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ChVector<double> v;
  ChVector<double> bstress_n;
  ChVector<double> bstress_m;
  ChVector<double> astress_m;
  ChVector<double> astress_n;
  double local_108;
  long lStack_100;
  double local_e8 [4];
  undefined8 local_c8;
  undefined8 uStack_c0;
  double local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  
  lVar7 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0.0;
  local_78 = 0.0;
  local_88 = 0;
  uStack_80 = 0;
  local_b8 = 0.0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_98 = 0.0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_e8[0] = strain_e->m_data[0];
  local_e8[1] = strain_e->m_data[1];
  local_e8[2] = strain_e->m_data[2];
  local_48 = strain_k->m_data[0];
  dStack_40 = strain_k->m_data[1];
  local_38 = strain_k->m_data[2];
  iVar5 = (*this->_vptr_ChElasticityCosserat[2])();
  uVar6 = CONCAT71((uint7)(uint3)((uint)iVar5 >> 8),7);
  uVar8 = (ushort)uVar6;
  do {
    local_e8[lVar7] = local_e8[lVar7] + 1e-06;
    (*this->_vptr_ChElasticityCosserat[2])(this,&local_c8,&local_a8,local_e8,&local_48);
    auVar1._8_8_ = uStack_c0;
    auVar1._0_8_ = local_c8;
    uVar9 = uVar6 & 0xffff;
    auVar4._8_8_ = uStack_60;
    auVar4._0_8_ = local_68;
    auVar1 = vsubpd_avx(auVar1,auVar4);
    local_108 = auVar1._0_8_;
    lStack_100 = auVar1._8_8_;
    auVar10._0_8_ = local_108 * 1000000.0;
    auVar10._8_8_ = (double)((ulong)((byte)(uVar8 >> 1) & 1) * lStack_100) * 1000000.0;
    auVar10._16_8_ =
         (double)((ulong)((byte)(uVar8 >> 2) & 1) * (long)(local_b8 - local_58)) * 1000000.0;
    auVar10._24_8_ = 0;
    vscatterqpd_avx512vl(ZEXT832(K) + _DAT_0096bbc0,uVar9,auVar10);
    auVar2._8_8_ = uStack_a0;
    auVar2._0_8_ = local_a8;
    auVar3._8_8_ = uStack_80;
    auVar3._0_8_ = local_88;
    auVar1 = vsubpd_avx(auVar2,auVar3);
    local_108 = auVar1._0_8_;
    lStack_100 = auVar1._8_8_;
    auVar11._0_8_ = local_108 * 1000000.0;
    auVar11._8_8_ = (double)((ulong)((byte)(uVar8 >> 1) & 1) * lStack_100) * 1000000.0;
    auVar11._16_8_ =
         (double)((ulong)((byte)(uVar8 >> 2) & 1) * (long)(local_98 - local_78)) * 1000000.0;
    auVar11._24_8_ = 0;
    vscatterqpd_avx512vl(ZEXT832(K) + ZEXT832(0x90) + _DAT_0096bbc0,uVar9,auVar11);
    K = (ChMatrixNM<double,_6,_6> *)((long)K + 8);
    local_e8[lVar7] = local_e8[lVar7] + -1e-06;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_48 = local_48 + 1e-06;
  (*this->_vptr_ChElasticityCosserat[2])(this,&local_c8,&local_a8,local_e8);
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, 6, 6, 1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, 6, 6, 1>>]"
               );
}

Assistant:

void ChElasticityCosserat::ComputeStiffnessMatrix(ChMatrixNM<double, 6, 6>& K,
                                                  const ChVector<>& strain_e,
                                                  const ChVector<>& strain_k) {
    double epsi = 1e-6;
    double invepsi = 1.0 / epsi;
    ChVector<> astress_n;
    ChVector<> astress_m;
    ChVector<> bstress_n;
    ChVector<> bstress_m;
    ChVector<> strain_e_inc = strain_e;
    ChVector<> strain_k_inc = strain_k;
    this->ComputeStress(astress_n, astress_m, strain_e, strain_k);
    for (int i = 0; i < 3; ++i) {
        strain_e_inc[i] += epsi;
        this->ComputeStress(bstress_n, bstress_m, strain_e_inc, strain_k_inc);
        K.block(0, i, 3, 1) = (bstress_n - astress_n).eigen() * invepsi;
        K.block(3, i, 3, 1) = (bstress_m - astress_m).eigen() * invepsi;
        strain_e_inc[i] -= epsi;
    }
    for (int i = 0; i < 3; ++i) {
        strain_k_inc[i] += epsi;
        this->ComputeStress(bstress_n, bstress_m, strain_e_inc, strain_k_inc);
        K.block(0, i + 3, 3, 3) = (bstress_n - astress_n).eigen() * invepsi;
        K.block(3, i + 3, 3, 3) = (bstress_m - astress_m).eigen() * invepsi;
        strain_k_inc[i] -= epsi;
    }
}